

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_hostapi_skeleton.c
# Opt level: O1

PaError OpenStream(PaUtilHostApiRepresentation *hostApi,PaStream **s,
                  PaStreamParameters *inputParameters,PaStreamParameters *outputParameters,
                  double sampleRate,unsigned_long framesPerBuffer,PaStreamFlags streamFlags,
                  PaStreamCallback *streamCallback,void *userData)

{
  PaError PVar1;
  PaSampleFormat hostOutputSampleFormat;
  PaUtilStreamRepresentation *streamRepresentation;
  unsigned_long uVar2;
  PaSampleFormat format;
  PaStreamCallback *streamCallback_00;
  PaSampleFormat format_00;
  int outputChannelCount;
  PaUtilStreamInterface *streamInterface;
  PaSampleFormat hostInputSampleFormat;
  int inputChannelCount;
  PaStreamCallback **bp;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  outputChannelCount = 0;
  inputChannelCount = 0;
  format_00 = 8;
  hostInputSampleFormat = 8;
  if (inputParameters != (PaStreamParameters *)0x0) {
    if ((long)inputParameters->device == -2) {
      return -0x270c;
    }
    inputChannelCount = inputParameters->channelCount;
    if (hostApi->deviceInfos[inputParameters->device]->maxInputChannels < inputChannelCount) {
      return -0x270e;
    }
    if (inputParameters->hostApiSpecificStreamInfo != (void *)0x0) {
      return -0x2700;
    }
    format_00 = inputParameters->sampleFormat;
    hostInputSampleFormat = PaUtil_SelectClosestAvailableFormat(8,format_00);
  }
  format = 8;
  hostOutputSampleFormat = 8;
  if (outputParameters != (PaStreamParameters *)0x0) {
    if ((long)outputParameters->device == -2) {
      return -0x270c;
    }
    outputChannelCount = outputParameters->channelCount;
    if (hostApi->deviceInfos[outputParameters->device]->maxOutputChannels < outputChannelCount) {
      return -0x270e;
    }
    if (outputParameters->hostApiSpecificStreamInfo != (void *)0x0) {
      return -0x2700;
    }
    format = outputParameters->sampleFormat;
    hostOutputSampleFormat = PaUtil_SelectClosestAvailableFormat(8,format);
  }
  PVar1 = -0x270b;
  if ((short)(streamFlags >> 0x10) == 0) {
    streamRepresentation = (PaUtilStreamRepresentation *)PaUtil_AllocateMemory(0x1a0);
    if (streamRepresentation == (PaUtilStreamRepresentation *)0x0) {
      PVar1 = -0x2708;
    }
    else {
      if (streamCallback == (PaStreamCallback *)0x0) {
        streamInterface = (PaUtilStreamInterface *)&hostApi[2].info.deviceCount;
        streamCallback_00 = (PaStreamCallback *)0x0;
      }
      else {
        streamInterface = (PaUtilStreamInterface *)(hostApi + 1);
        streamCallback_00 = streamCallback;
      }
      PaUtil_InitializeStreamRepresentation
                (streamRepresentation,streamInterface,streamCallback_00,userData);
      PaUtil_InitializeCpuLoadMeasurer
                ((PaUtilCpuLoadMeasurer *)(streamRepresentation + 1),sampleRate);
      bp = &streamRepresentation[1].streamCallback;
      PVar1 = PaUtil_InitializeBufferProcessor
                        ((PaUtilBufferProcessor *)bp,inputChannelCount,format_00,
                         hostInputSampleFormat,outputChannelCount,format,hostOutputSampleFormat,
                         sampleRate,streamFlags,framesPerBuffer,framesPerBuffer,
                         paUtilFixedHostBufferSize,streamCallback,userData);
      if (PVar1 == 0) {
        uVar2 = PaUtil_GetBufferProcessorInputLatencyFrames((PaUtilBufferProcessor *)bp);
        auVar3._8_4_ = (int)(uVar2 >> 0x20);
        auVar3._0_8_ = uVar2;
        auVar3._12_4_ = 0x45300000;
        (streamRepresentation->streamInfo).inputLatency =
             ((auVar3._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) / sampleRate;
        uVar2 = PaUtil_GetBufferProcessorOutputLatencyFrames((PaUtilBufferProcessor *)bp);
        auVar4._8_4_ = (int)(uVar2 >> 0x20);
        auVar4._0_8_ = uVar2;
        auVar4._12_4_ = 0x45300000;
        (streamRepresentation->streamInfo).outputLatency =
             ((auVar4._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) / sampleRate;
        (streamRepresentation->streamInfo).sampleRate = sampleRate;
        streamRepresentation[5].nextOpenStream = (PaUtilStreamRepresentation *)framesPerBuffer;
        *s = streamRepresentation;
        return 0;
      }
    }
    if (streamRepresentation != (PaUtilStreamRepresentation *)0x0) {
      PaUtil_FreeMemory(streamRepresentation);
    }
  }
  return PVar1;
}

Assistant:

static PaError OpenStream( struct PaUtilHostApiRepresentation *hostApi,
                           PaStream** s,
                           const PaStreamParameters *inputParameters,
                           const PaStreamParameters *outputParameters,
                           double sampleRate,
                           unsigned long framesPerBuffer,
                           PaStreamFlags streamFlags,
                           PaStreamCallback *streamCallback,
                           void *userData )
{
    PaError result = paNoError;
    PaSkeletonHostApiRepresentation *skeletonHostApi = (PaSkeletonHostApiRepresentation*)hostApi;
    PaSkeletonStream *stream = 0;
    unsigned long framesPerHostBuffer = framesPerBuffer; /* these may not be equivalent for all implementations */
    int inputChannelCount, outputChannelCount;
    PaSampleFormat inputSampleFormat, outputSampleFormat;
    PaSampleFormat hostInputSampleFormat, hostOutputSampleFormat;


    if( inputParameters )
    {
        inputChannelCount = inputParameters->channelCount;
        inputSampleFormat = inputParameters->sampleFormat;

        /* unless alternate device specification is supported, reject the use of
            paUseHostApiSpecificDeviceSpecification */

        if( inputParameters->device == paUseHostApiSpecificDeviceSpecification )
            return paInvalidDevice;

        /* check that input device can support inputChannelCount */
        if( inputChannelCount > hostApi->deviceInfos[ inputParameters->device ]->maxInputChannels )
            return paInvalidChannelCount;

        /* validate inputStreamInfo */
        if( inputParameters->hostApiSpecificStreamInfo )
            return paIncompatibleHostApiSpecificStreamInfo; /* this implementation doesn't use custom stream info */

        /* IMPLEMENT ME - establish which  host formats are available */
        hostInputSampleFormat =
            PaUtil_SelectClosestAvailableFormat( paInt16 /* native formats */, inputSampleFormat );
    }
    else
    {
        inputChannelCount = 0;
        inputSampleFormat = hostInputSampleFormat = paInt16; /* Surpress 'uninitialised var' warnings. */
    }

    if( outputParameters )
    {
        outputChannelCount = outputParameters->channelCount;
        outputSampleFormat = outputParameters->sampleFormat;
        
        /* unless alternate device specification is supported, reject the use of
            paUseHostApiSpecificDeviceSpecification */

        if( outputParameters->device == paUseHostApiSpecificDeviceSpecification )
            return paInvalidDevice;

        /* check that output device can support inputChannelCount */
        if( outputChannelCount > hostApi->deviceInfos[ outputParameters->device ]->maxOutputChannels )
            return paInvalidChannelCount;

        /* validate outputStreamInfo */
        if( outputParameters->hostApiSpecificStreamInfo )
            return paIncompatibleHostApiSpecificStreamInfo; /* this implementation doesn't use custom stream info */

        /* IMPLEMENT ME - establish which  host formats are available */
        hostOutputSampleFormat =
            PaUtil_SelectClosestAvailableFormat( paInt16 /* native formats */, outputSampleFormat );
    }
    else
    {
        outputChannelCount = 0;
        outputSampleFormat = hostOutputSampleFormat = paInt16; /* Surpress 'uninitialized var' warnings. */
    }

    /*
        IMPLEMENT ME:

        ( the following two checks are taken care of by PaUtil_InitializeBufferProcessor() FIXME - checks needed? )

            - check that input device can support inputSampleFormat, or that
                we have the capability to convert from outputSampleFormat to
                a native format

            - check that output device can support outputSampleFormat, or that
                we have the capability to convert from outputSampleFormat to
                a native format

            - if a full duplex stream is requested, check that the combination
                of input and output parameters is supported

            - check that the device supports sampleRate

            - alter sampleRate to a close allowable rate if possible / necessary

            - validate suggestedInputLatency and suggestedOutputLatency parameters,
                use default values where necessary
    */




    /* validate platform specific flags */
    if( (streamFlags & paPlatformSpecificFlags) != 0 )
        return paInvalidFlag; /* unexpected platform specific flag */


    stream = (PaSkeletonStream*)PaUtil_AllocateMemory( sizeof(PaSkeletonStream) );
    if( !stream )
    {
        result = paInsufficientMemory;
        goto error;
    }

    if( streamCallback )
    {
        PaUtil_InitializeStreamRepresentation( &stream->streamRepresentation,
                                               &skeletonHostApi->callbackStreamInterface, streamCallback, userData );
    }
    else
    {
        PaUtil_InitializeStreamRepresentation( &stream->streamRepresentation,
                                               &skeletonHostApi->blockingStreamInterface, streamCallback, userData );
    }

    PaUtil_InitializeCpuLoadMeasurer( &stream->cpuLoadMeasurer, sampleRate );


    /* we assume a fixed host buffer size in this example, but the buffer processor
        can also support bounded and unknown host buffer sizes by passing 
        paUtilBoundedHostBufferSize or paUtilUnknownHostBufferSize instead of
        paUtilFixedHostBufferSize below. */
        
    result =  PaUtil_InitializeBufferProcessor( &stream->bufferProcessor,
              inputChannelCount, inputSampleFormat, hostInputSampleFormat,
              outputChannelCount, outputSampleFormat, hostOutputSampleFormat,
              sampleRate, streamFlags, framesPerBuffer,
              framesPerHostBuffer, paUtilFixedHostBufferSize,
              streamCallback, userData );
    if( result != paNoError )
        goto error;


    /*
        IMPLEMENT ME: initialise the following fields with estimated or actual
        values.
    */
    stream->streamRepresentation.streamInfo.inputLatency =
            (PaTime)PaUtil_GetBufferProcessorInputLatencyFrames(&stream->bufferProcessor) / sampleRate; /* inputLatency is specified in _seconds_ */
    stream->streamRepresentation.streamInfo.outputLatency =
            (PaTime)PaUtil_GetBufferProcessorOutputLatencyFrames(&stream->bufferProcessor) / sampleRate; /* outputLatency is specified in _seconds_ */
    stream->streamRepresentation.streamInfo.sampleRate = sampleRate;

    
    /*
        IMPLEMENT ME:
            - additional stream setup + opening
    */

    stream->framesPerHostCallback = framesPerHostBuffer;

    *s = (PaStream*)stream;

    return result;

error:
    if( stream )
        PaUtil_FreeMemory( stream );

    return result;
}